

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O2

bool __thiscall xray_re::xr_ogf::load_ogf(xr_ogf *this,char *path,string *name)

{
  xr_file_system *this_00;
  xr_reader *pxVar1;
  
  this_00 = xr_file_system::instance();
  pxVar1 = xr_file_system::r_open(this_00,path,name);
  if (pxVar1 != (xr_reader *)0x0) {
    (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x15])(this,pxVar1);
    (*pxVar1->_vptr_xr_reader[1])(pxVar1);
  }
  return pxVar1 != (xr_reader *)0x0;
}

Assistant:

bool xr_ogf::load_ogf(const char* path, const std::string& name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r == 0)
		return false;
	load_ogf(*r);
	fs.r_close(r);
	return true;
}